

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ValidPadding::SerializeWithCachedSizes
          (ValidPadding *this,CodedOutputStream *output)

{
  if (this->paddingamounts_ != (BorderAmounts *)0x0 &&
      this != (ValidPadding *)&_ValidPadding_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->paddingamounts_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ValidPadding::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ValidPadding)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.BorderAmounts paddingAmounts = 1;
  if (this->has_paddingamounts()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->paddingamounts_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ValidPadding)
}